

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O2

void __thiscall TPZFileStream::ReadData<unsigned_int>(TPZFileStream *this,uint *p,int howMany)

{
  ulong uVar1;
  bool bVar2;
  char buf [100];
  
  if (((&this->field_0x28)[*(long *)(*(long *)&this->fIn + -0x18)] & 5) != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZFileStream.cpp"
               ,0x45);
  }
  if (howMany != 0) {
    uVar1 = 0;
    if (0 < howMany) {
      uVar1 = (ulong)(uint)howMany;
    }
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      std::istream::_M_extract<unsigned_int>((uint *)&this->fIn);
    }
    std::istream::getline((char *)&this->fIn,(long)buf);
  }
  return;
}

Assistant:

void TPZFileStream::ReadData(T *p, int howMany) {
        int c;
        char buf[100];
        if(!fIn)
        {
            DebugStop();
        }
        if(howMany)
        {
            for(c=0; c<howMany; c++) fIn >> p[c];
            fIn.getline(buf,100);
        }
#ifdef PZDEBUG
        if (fIn.bad()) {
            PZError << "TFileStream:Could not read from stream" << std::endl;
            DebugStop();
        }
#endif
    }